

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderPrimitiveCounterRestartingPrimitive::setUpVertexAttributeArrays
          (GeometryShaderPrimitiveCounterRestartingPrimitive *this)

{
  ulong __n;
  GLuint GVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *__s;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar5;
  
  iVar2 = (*((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  uVar14 = (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
           m_numberOfVerticesPerOneInputPrimitive *
           (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
           m_numberOfDrawnPrimitives + this->m_numberOfRestarts;
  uVar3 = (*((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[2])();
  uVar7 = -(uint)((uVar3 & 0x300) == 0) | uVar14;
  uVar13 = 1;
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_bo_id);
  (**(code **)(lVar5 + 0x40))(0x8893,this->m_bo_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not generate a buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x3f2);
  __n = (ulong)uVar14 * 4;
  __s = operator_new__(__n);
  memset(__s,0,__n);
  uVar3 = this->m_numberOfRestarts;
  if ((ulong)uVar3 != 0) {
    GVar1 = (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
            m_numberOfVerticesPerOneInputPrimitive;
    uVar6 = 0;
    do {
      iVar2 = (int)uVar6;
      iVar12 = (int)uVar13;
      if (GVar1 * iVar2 + 1 < uVar14) {
        uVar8 = (ulong)(GVar1 * (iVar2 + 1) + iVar2);
        iVar10 = GVar1 * iVar2;
        do {
          iVar9 = (int)uVar13;
          iVar11 = iVar9;
          if ((uVar13 < uVar8) || (iVar11 = iVar10, uVar8 < uVar13)) {
            *(int *)((long)__s + uVar13 * 4) = iVar11 - iVar2;
          }
          uVar13 = uVar13 + 1;
          iVar10 = iVar9;
        } while (uVar13 < uVar14);
      }
      else {
        uVar8 = (ulong)(GVar1 * (iVar2 + 1) + iVar2);
      }
      uVar6 = uVar6 + 1;
      *(uint *)((long)__s + uVar8 * 4) = uVar7;
      uVar13 = (ulong)(iVar12 + GVar1);
    } while (uVar6 != uVar3);
  }
  (**(code **)(lVar5 + 0x150))(0x8893,__n,__s,0x88e4);
  operator_delete__(__s);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not create element array buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x418);
  uVar3 = (*((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[2])();
  if ((uVar3 & 0x300) == 0) {
    return;
  }
  (**(code **)(lVar5 + 0x1048))(uVar7);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set primitive restart index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x41e);
  return;
}

Assistant:

void GeometryShaderPrimitiveCounterRestartingPrimitive::setUpVertexAttributeArrays()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a buffer object to hold the element data */
	glw::GLuint*	   indices = DE_NULL;
	const unsigned int nIndices =
		m_testConfiguration.m_numberOfDrawnPrimitives * m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive +
		m_numberOfRestarts;
	unsigned int restartIndex;
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		restartIndex = nIndices;
	}
	else
	{
		restartIndex = 0xFFFFFFFF;
	}

	gl.genBuffers(1, &m_bo_id);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate a buffer object");

	/* Prepare the data we will later use for configuring buffer object storage contents */
	indices = new unsigned int[nIndices];
	memset(indices, 0, nIndices * sizeof(unsigned int));

	for (unsigned int restartNr = 0; restartNr < m_numberOfRestarts; ++restartNr)
	{
		for (unsigned int i = m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * restartNr + 1; i < nIndices;
			 i++)
		{
			if (i < m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr)
			{
				indices[i] = i - restartNr;
			}
			else if (i > m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr)
			{
				indices[i] = (i - 1 - restartNr);
			}
		}
		indices[m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr] =
			restartIndex;
	}

	/*
	 m_testCtx.getLog() << tcu::TestLog::Message << "Indices table [ " << tcu::TestLog::EndMessage;
	 for (unsigned int i = 0; i < nIndices; i++)
	 {
	 m_testCtx.getLog() << tcu::TestLog::Message << indices[i] << ", " << tcu::TestLog::EndMessage;
	 }
	 m_testCtx.getLog() << tcu::TestLog::Message << " ]" << tcu::TestLog::EndMessage;
	 */

	/* Set up buffer object data storage */
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(glw::GLuint) * nIndices, indices, GL_STATIC_DRAW);
	/* Free the buffer we no longer need */
	delete[] indices;
	indices = NULL;
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create element array buffer object");

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Set up primitive restarting */
		gl.primitiveRestartIndex(restartIndex);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set primitive restart index");
	}
}